

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::InputScalar(char *label,ImGuiDataType data_type,void *p_data,void *p_step,
                       void *p_step_fast,char *format,ImGuiInputTextFlags flags)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  char *text_end;
  void *pvVar6;
  uint flags_00;
  float fVar7;
  float fVar8;
  float fVar9;
  ImVec2 local_80;
  char buf [64];
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    if (format == (char *)0x0) {
      format = GDataTypeInfo[data_type].PrintFmt;
    }
    DataTypeFormatString(buf,0x40,data_type,p_data,format);
    flags_00 = (uint)((flags & 0x20002U) == 0) | flags | 0x8000010;
    if (p_step == (void *)0x0) {
      bVar4 = InputText(label,buf,0x40,flags_00,(ImGuiInputTextCallback)0x0,(void *)0x0);
      if (!bVar4) {
        return false;
      }
      bVar4 = DataTypeApplyFromText(buf,data_type,p_data,format);
      if (!bVar4) goto LAB_001549db;
    }
    else {
      fVar7 = GetFrameHeight();
      BeginGroup();
      PushID(label);
      fVar8 = CalcItemWidth();
      fVar9 = (pIVar3->Style).ItemInnerSpacing.x + fVar7;
      fVar8 = fVar8 - (fVar9 + fVar9);
      fVar9 = 1.0;
      if (1.0 <= fVar8) {
        fVar9 = fVar8;
      }
      SetNextItemWidth(fVar9);
      bVar5 = false;
      bVar4 = InputText("",buf,0x40,flags_00,(ImGuiInputTextCallback)0x0,(void *)0x0);
      if (bVar4) {
        bVar5 = DataTypeApplyFromText(buf,data_type,p_data,format);
      }
      IVar2 = (pIVar3->Style).FramePadding;
      (pIVar3->Style).FramePadding.x = IVar2.y;
      if (((uint)flags >> 0xe & 1) != 0) {
        BeginDisabled(true);
      }
      SameLine(0.0,(pIVar3->Style).ItemInnerSpacing.x);
      local_80.x = fVar7;
      local_80.y = fVar7;
      bVar4 = ButtonEx("-",&local_80,0x2400);
      if (bVar4) {
        pvVar6 = p_step;
        if ((pIVar3->IO).KeyCtrl != false) {
          pvVar6 = p_step_fast;
        }
        if (p_step_fast == (void *)0x0) {
          pvVar6 = p_step;
        }
        DataTypeApplyOp(data_type,0x2d,p_data,p_data,pvVar6);
        bVar5 = true;
      }
      SameLine(0.0,(pIVar3->Style).ItemInnerSpacing.x);
      local_80.x = fVar7;
      local_80.y = fVar7;
      bVar4 = ButtonEx("+",&local_80,0x2400);
      if (bVar4) {
        pvVar6 = p_step;
        if ((pIVar3->IO).KeyCtrl != false) {
          pvVar6 = p_step_fast;
        }
        if (p_step_fast == (void *)0x0) {
          pvVar6 = p_step;
        }
        DataTypeApplyOp(data_type,0x2b,p_data,p_data,pvVar6);
        bVar5 = true;
      }
      if (((uint)flags >> 0xe & 1) != 0) {
        EndDisabled();
      }
      text_end = FindRenderedTextEnd(label,(char *)0x0);
      if (text_end != label) {
        SameLine(0.0,(pIVar3->Style).ItemInnerSpacing.x);
        TextEx(label,text_end,0);
      }
      (pIVar3->Style).FramePadding = IVar2;
      PopID();
      EndGroup();
      if (bVar5 == false) goto LAB_001549db;
    }
    MarkItemEdited((pIVar3->LastItemData).ID);
    bVar4 = true;
  }
  else {
LAB_001549db:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ImGui::InputScalar(const char* label, ImGuiDataType data_type, void* p_data, const void* p_step, const void* p_step_fast, const char* format, ImGuiInputTextFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;

    if (format == NULL)
        format = DataTypeGetInfo(data_type)->PrintFmt;

    char buf[64];
    DataTypeFormatString(buf, IM_ARRAYSIZE(buf), data_type, p_data, format);

    bool value_changed = false;
    if ((flags & (ImGuiInputTextFlags_CharsHexadecimal | ImGuiInputTextFlags_CharsScientific)) == 0)
        flags |= ImGuiInputTextFlags_CharsDecimal;
    flags |= ImGuiInputTextFlags_AutoSelectAll;
    flags |= ImGuiInputTextFlags_NoMarkEdited;  // We call MarkItemEdited() ourselves by comparing the actual data rather than the string.

    if (p_step != NULL)
    {
        const float button_size = GetFrameHeight();

        BeginGroup(); // The only purpose of the group here is to allow the caller to query item data e.g. IsItemActive()
        PushID(label);
        SetNextItemWidth(ImMax(1.0f, CalcItemWidth() - (button_size + style.ItemInnerSpacing.x) * 2));
        if (InputText("", buf, IM_ARRAYSIZE(buf), flags)) // PushId(label) + "" gives us the expected ID from outside point of view
            value_changed = DataTypeApplyFromText(buf, data_type, p_data, format);

        // Step buttons
        const ImVec2 backup_frame_padding = style.FramePadding;
        style.FramePadding.x = style.FramePadding.y;
        ImGuiButtonFlags button_flags = ImGuiButtonFlags_Repeat | ImGuiButtonFlags_DontClosePopups;
        if (flags & ImGuiInputTextFlags_ReadOnly)
            BeginDisabled();
        SameLine(0, style.ItemInnerSpacing.x);
        if (ButtonEx("-", ImVec2(button_size, button_size), button_flags))
        {
            DataTypeApplyOp(data_type, '-', p_data, p_data, g.IO.KeyCtrl && p_step_fast ? p_step_fast : p_step);
            value_changed = true;
        }
        SameLine(0, style.ItemInnerSpacing.x);
        if (ButtonEx("+", ImVec2(button_size, button_size), button_flags))
        {
            DataTypeApplyOp(data_type, '+', p_data, p_data, g.IO.KeyCtrl && p_step_fast ? p_step_fast : p_step);
            value_changed = true;
        }
        if (flags & ImGuiInputTextFlags_ReadOnly)
            EndDisabled();

        const char* label_end = FindRenderedTextEnd(label);
        if (label != label_end)
        {
            SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_end);
        }
        style.FramePadding = backup_frame_padding;

        PopID();
        EndGroup();
    }
    else
    {
        if (InputText(label, buf, IM_ARRAYSIZE(buf), flags))
            value_changed = DataTypeApplyFromText(buf, data_type, p_data, format);
    }
    if (value_changed)
        MarkItemEdited(g.LastItemData.ID);

    return value_changed;
}